

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeBase * anon_unknown.dwarf_ff84f::LookupTypeByName(ExpressionContext *ctx,uint nameHash)

{
  TypeBase *pTVar1;
  SynBase *pSVar2;
  TypeLookupResult *pTVar3;
  long lVar4;
  ScopeData *pSVar5;
  
  pSVar5 = (ScopeData *)&ctx->scope;
  while( true ) {
    while( true ) {
      do {
        pSVar5 = pSVar5->scope;
        if (pSVar5 == (ScopeData *)0x0) {
          return (TypeBase *)0x0;
        }
        pTVar3 = DirectChainedMap<TypeLookupResult>::find(&pSVar5->typeLookupMap,nameHash);
      } while (pTVar3 == (TypeLookupResult *)0x0);
      pTVar1 = pTVar3->type;
      pSVar2 = ctx->lookupLocation;
      if (pTVar1 != (TypeBase *)0x0) break;
      if ((((pSVar2 == (SynBase *)0x0) || (pSVar5->unrestricted != false)) ||
          (pTVar3->alias->importModule != (ModuleData *)0x0)) ||
         ((pTVar3->alias->source->pos).begin <= (pSVar2->pos).begin)) {
        return pTVar3->alias->type;
      }
    }
    if (pSVar2 == (SynBase *)0x0) {
      return pTVar1;
    }
    if (pSVar5->unrestricted != false) break;
    if (pTVar1->importModule != (ModuleData *)0x0) {
      return pTVar1;
    }
    lVar4 = 0xd8;
    if (pTVar1->typeID != 0x18) {
      if (pTVar1->typeID != 0x16) {
        return pTVar1;
      }
      lVar4 = 0xc0;
    }
    lVar4 = *(long *)((long)&pTVar1->_vptr_TypeBase + lVar4);
    if (lVar4 == 0) {
      return pTVar1;
    }
    if (*(char **)(lVar4 + 0x20) <= (pSVar2->pos).begin) {
      return pTVar1;
    }
  }
  return pTVar1;
}

Assistant:

TypeBase* LookupTypeByName(ExpressionContext &ctx, unsigned nameHash)
	{
		ScopeData *scope = ctx.scope;

		while(scope)
		{
			if(TypeLookupResult *lookup = scope->typeLookupMap.find(nameHash))
			{
				if(TypeBase *type = lookup->type)
				{
					// Check type visibility
					if(ctx.lookupLocation && !scope->unrestricted && !type->importModule)
					{
						SynBase *typeLocation = NULL;

						if(TypeClass *exact = getType<TypeClass>(type))
							typeLocation = exact->source;
						else if(TypeGenericClassProto *exact = getType<TypeGenericClassProto>(type))
							typeLocation = exact->definition;

						if(typeLocation && typeLocation->pos.begin > ctx.lookupLocation->pos.begin)
						{
							scope = scope->scope;
							continue;
						}
					}

					return lookup->type;
				}

				// Check alias visibility
				if(ctx.lookupLocation && !scope->unrestricted && !lookup->alias->importModule)
				{
					if(lookup->alias->source->pos.begin > ctx.lookupLocation->pos.begin)
					{
						scope = scope->scope;
						continue;
					}
				}

				return lookup->alias->type;
			}

			scope = scope->scope;
		}

		return NULL;
	}